

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void __thiscall
wasm::
CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
::doEndTryTable(CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                *this,Optimizer *self,Expression **currp)

{
  _Base_ptr *pp_Var1;
  BranchUtils *this_00;
  size_t *psVar2;
  long lVar3;
  void *pvVar4;
  mapped_type *this_01;
  _Base_ptr p_Var5;
  size_t *psVar6;
  undefined1 auStack_88 [8];
  Name target;
  NameSet catchTargets;
  BasicBlock *pred;
  
  this_00 = (BranchUtils *)
            (self->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
            ).super_Pass._vptr_Pass;
  if (*this_00 == (BranchUtils)0x35) {
    catchTargets._M_t._M_impl._0_4_ = 0;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&catchTargets;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&catchTargets;
    BranchUtils::
    operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
              (this_00,(Expression *)&target.super_IString.str._M_str,(anon_class_8_1_ba1d7401)currp
              );
    if (catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&catchTargets) {
      p_Var5 = catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        auStack_88 = *(undefined1 (*) [8])(p_Var5 + 1);
        target.super_IString.str._M_len = (size_t)p_Var5[1]._M_parent;
        psVar2 = *(size_t **)(*(long *)&this->hasSyntheticExit + -0x10);
        for (psVar6 = *(size_t **)(*(long *)&this->hasSyntheticExit + -0x18); psVar6 != psVar2;
            psVar6 = psVar6 + 1) {
          catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = *psVar6;
          this_01 = std::
                    map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>_>
                    ::operator[]((map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>_>
                                  *)&(this->loopLastBlockStack).
                                     super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (key_type *)auStack_88);
          std::
          vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
          ::push_back(this_01,(value_type *)
                              &catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)&catchTargets);
    }
    lVar3 = *(long *)&this->hasSyntheticExit;
    *(long *)&this->hasSyntheticExit = lVar3 + -0x18;
    pvVar4 = *(void **)(lVar3 + -0x18);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)(lVar3 + -8) - (long)pvVar4);
    }
    pp_Var1 = &(this->debugIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *pp_Var1 = (_Base_ptr)&(*pp_Var1)[-1]._M_right;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&target.super_IString.str._M_str);
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::TryTable]");
}

Assistant:

static void doEndTryTable(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<TryTable>();

    auto catchTargets = BranchUtils::getUniqueTargets(curr);
    // Add catch destinations to the targets.
    for (auto target : catchTargets) {
      auto& preds = self->throwingInstsStack.back();
      for (auto* pred : preds) {
        self->branches[target].push_back(pred);
      }
    }

    self->throwingInstsStack.pop_back();
    self->tryStack.pop_back();
  }